

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O1

void __thiscall CMU462::PathTracer::worker_thread(PathTracer *this)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  WorkItem work;
  WorkItem local_38;
  
  lVar2 = std::chrono::_V2::steady_clock::now();
  local_38.tile_x = 0;
  local_38.tile_y = 0;
  local_38.tile_w = 0;
  local_38.tile_h = 0;
  if (this->continueRaytracing == true) {
    do {
      bVar1 = WorkQueue<CMU462::WorkItem>::try_get_work(&this->workQueue,&local_38);
      if (!bVar1) break;
      raytrace_tile(this,local_38.tile_x,local_38.tile_y,local_38.tile_w,local_38.tile_h);
    } while (this->continueRaytracing != false);
  }
  LOCK();
  (this->workerDoneCount).super___atomic_base<int>._M_i =
       (this->workerDoneCount).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if ((this->continueRaytracing == false) &&
     (this->numWorkerThreads == (long)(this->workerDoneCount).super___atomic_base<int>._M_i)) {
    std::chrono::_V2::steady_clock::now();
    fwrite("Canceled!\n",10,1,_stdout);
    this->state = READY;
  }
  if ((this->continueRaytracing == true) &&
     (this->numWorkerThreads == (long)(this->workerDoneCount).super___atomic_base<int>._M_i)) {
    lVar3 = std::chrono::_V2::steady_clock::now();
    fprintf(_stdout,"Done! (%.4fs)\n",SUB84((double)(lVar3 - lVar2) / 1000000000.0,0));
    this->state = DONE;
  }
  return;
}

Assistant:

void PathTracer::worker_thread() {

    Timer timer;
    timer.start();

    WorkItem work;
    while (continueRaytracing && workQueue.try_get_work(&work)) {
      raytrace_tile(work.tile_x, work.tile_y, work.tile_w, work.tile_h);
    }

    workerDoneCount++;
    if (!continueRaytracing && workerDoneCount == numWorkerThreads) {
      timer.stop();
      fprintf(stdout, "Canceled!\n");
      state = READY;
    }

    if (continueRaytracing && workerDoneCount == numWorkerThreads) {
      timer.stop();
      fprintf(stdout, "Done! (%.4fs)\n", timer.duration());
      state = DONE;
    }
  }